

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void * parasail_memalign(size_t alignment,size_t size)

{
  FILE *__stream;
  int __errnum;
  char *pcVar1;
  void *pvVar2;
  void *ptr;
  void *local_18;
  
  local_18 = (void *)0x0;
  __errnum = posix_memalign(&local_18,alignment,size);
  __stream = _stderr;
  if (__errnum == 0) {
    pvVar2 = local_18;
    if (local_18 == (void *)0x0) {
      fprintf(_stderr,"%s: failed\n","parasail_memalign");
      pvVar2 = local_18;
    }
  }
  else {
    pcVar1 = strerror(__errnum);
    pvVar2 = (void *)0x0;
    fprintf(__stream,"%s: posix_memalign failed: %s\n","parasail_memalign",pcVar1);
  }
  return pvVar2;
}

Assistant:

void* parasail_memalign(size_t alignment, size_t size)
{
    void *ptr = NULL;
#if defined(HAVE__ALIGNED_MALLOC)
    ptr = _aligned_malloc(size, alignment);
#elif defined(HAVE_POSIX_MEMALIGN)
    int retcode = posix_memalign(&ptr, alignment, size);
    if (0 != retcode) {
        fprintf(stderr, "%s: posix_memalign failed: %s\n",
                __func__, strerror(retcode));
        return NULL;
    }
#elif defined(HAVE_ALIGNED_ALLOC)
    ptr = aligned_alloc(alignment, size);
#elif defined(HAVE_MEMALIGN)
    ptr = memalign(alignment, size);
#else
#error "No suitable memory alignment routine found."
#endif
    if (NULL == ptr) {
        fprintf(stderr, "%s: failed\n", __func__);
    }
    return ptr;
}